

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zip_unchange_all.c
# Opt level: O1

int zip_unchange_all(zip_t *za)

{
  _Bool _Var1;
  uint uVar2;
  uint uVar3;
  zip_uint64_t idx;
  
  _Var1 = _zip_hash_revert(za->names,&za->error);
  uVar2 = 0xffffffff;
  if (_Var1) {
    if (za->nentry == 0) {
      uVar3 = 0;
    }
    else {
      idx = 0;
      uVar3 = 0;
      do {
        uVar2 = _zip_unchange(za,idx,1);
        uVar3 = uVar3 | uVar2;
        idx = idx + 1;
      } while (idx < za->nentry);
    }
    uVar2 = zip_unchange_archive(za);
    uVar2 = uVar2 | uVar3;
  }
  return uVar2;
}

Assistant:

ZIP_EXTERN int
zip_unchange_all(zip_t *za) {
    int ret;
    zip_uint64_t i;

    if (!_zip_hash_revert(za->names, &za->error)) {
	return -1;
    }

    ret = 0;
    for (i = 0; i < za->nentry; i++)
	ret |= _zip_unchange(za, i, 1);

    ret |= zip_unchange_archive(za);

    return ret;
}